

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexTextureTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::Vertex2DTextureCase::init(Vertex2DTextureCase *this,EVP_PKEY_CTX *ctx)

{
  RenderContext *renderCtx;
  pointer pPVar1;
  int i;
  int iVar2;
  RenderTarget *pRVar3;
  ShaderProgram *this_00;
  Texture2D *this_01;
  long lVar4;
  NotSupportedError *pNVar5;
  int levelNdx_1;
  pointer_____offset_0x10___ *ppuVar6;
  int levelNdx;
  uint uVar7;
  long lVar8;
  Vec4 gMax;
  Vector<float,_4> res_3;
  Vec4 cScale;
  Vec4 gMin;
  Vec4 cBias;
  Vector<float,_4> res_7;
  Vector<float,_4> res_6;
  ProgramSources sources;
  Vec4 local_1b8;
  uint local_1a0;
  uint local_19c;
  undefined8 local_198;
  undefined8 uStack_190;
  value_type local_188;
  Vec4 local_168;
  value_type local_158;
  Vec4 local_138;
  float local_128 [6];
  RGBA local_110 [4];
  undefined1 local_100 [16];
  undefined1 local_f0 [128];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_70;
  undefined1 local_50 [32];
  
  pRVar3 = Context::getRenderTarget((this->super_TestCase).m_context);
  if (pRVar3->m_numSamples != 0) {
    pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_100._0_8_ = local_f0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_100,"MSAA config not supported by this test","");
    tcu::NotSupportedError::NotSupportedError(pNVar5,(string *)local_100);
    __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  this_00 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_158,
             "#version 300 es\nin highp vec2 a_position;\nin highp vec2 a_texCoord;\nuniform highp sampler2D u_texture;\nuniform highp float u_lod;\nout mediump vec4 v_color;\n\nvoid main()\n{\n\tgl_Position = vec4(a_position, 0.0, 1.0);\n\tv_color = textureLod(u_texture, a_texCoord, u_lod);\n}\n"
             ,"");
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_188,
             "#version 300 es\nlayout(location = 0) out mediump vec4 dEQP_FragColor;\nin mediump vec4 v_color;\n\nvoid main()\n{\n\tdEQP_FragColor = v_color;\n}\n"
             ,"");
  local_50[0x10] = 0;
  local_50._17_8_ = 0;
  local_50._0_8_ = (pointer)0x0;
  local_50[8] = 0;
  local_50._9_7_ = 0;
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_100,0,0xac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_100,&local_158);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_f0 + 8),&local_188);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,(ProgramSources *)local_100);
  this->m_program = this_00;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_50);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_70);
  lVar8 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + lVar8));
    lVar8 = lVar8 + -0x18;
  } while (lVar8 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if ((this->m_program->m_program).m_info.linkOk == true) {
    lVar8 = 0x12;
    do {
      this_01 = (Texture2D *)operator_new(0x70);
      glu::Texture2D::Texture2D
                (this_01,((this->super_TestCase).m_context)->m_renderCtx,0x1907,0x1401,0x80,0x80);
      (&(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode)[lVar8] =
           (_func_int **)this_01;
      lVar8 = lVar8 + 1;
    } while (lVar8 == 0x13);
    tcu::getTextureFormatInfo
              ((TextureFormatInfo *)local_100,(TextureFormat *)&this->m_textures[0]->m_refTexture);
    local_158._M_dataplus._M_p = (pointer)local_100._0_8_;
    local_158._M_string_length = local_100._8_8_;
    local_188._M_dataplus._M_p = (pointer)0x0;
    local_188._M_string_length = 0;
    lVar8 = 0;
    do {
      *(float *)((long)&local_188._M_dataplus._M_p + lVar8 * 4) =
           *(float *)(local_f0 + lVar8 * 4) - *(float *)(local_100 + lVar8 * 4);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    lVar8 = 0;
    do {
      local_198 = 0xbf000000bf000000;
      uStack_190 = 0x40000000bf000000;
      local_1b8.m_data[0] = 0.0;
      local_1b8.m_data[1] = 0.0;
      local_1b8.m_data[2] = 0.0;
      local_1b8.m_data[3] = 0.0;
      lVar4 = 0;
      do {
        local_1b8.m_data[lVar4] =
             *(float *)((long)&local_198 + lVar4 * 4) *
             *(float *)((long)&local_188._M_dataplus._M_p + lVar4 * 4);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      local_168.m_data[0] = 0.0;
      local_168.m_data[1] = 0.0;
      local_168.m_data[2] = 0.0;
      local_168.m_data[3] = 0.0;
      lVar4 = 0;
      do {
        local_168.m_data[lVar4] =
             local_1b8.m_data[lVar4] + *(float *)((long)&local_158._M_dataplus._M_p + lVar4 * 4);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      local_138.m_data._0_8_ = &DAT_3f8000003f800000;
      local_138.m_data[2] = 1.0;
      local_138.m_data[3] = 0.0;
      local_198 = 0;
      uStack_190 = 0;
      lVar4 = 0;
      do {
        *(float *)((long)&local_198 + lVar4 * 4) =
             local_138.m_data[lVar4] * *(float *)((long)&local_188._M_dataplus._M_p + lVar4 * 4);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      local_1b8.m_data[0] = 0.0;
      local_1b8.m_data[1] = 0.0;
      local_1b8.m_data[2] = 0.0;
      local_1b8.m_data[3] = 0.0;
      lVar4 = 0;
      do {
        local_1b8.m_data[lVar4] =
             *(float *)((long)&local_198 + lVar4 * 4) +
             *(float *)((long)&local_158._M_dataplus._M_p + lVar4 * 4);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      tcu::Texture2D::allocLevel(&this->m_textures[0]->m_refTexture,(int)lVar8);
      tcu::fillWithComponentGradients
                ((this->m_textures[0]->m_refTexture).super_TextureLevelPyramid.m_access.
                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar8,&local_168,&local_1b8);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 8);
    lVar8 = 0;
    do {
      tcu::Texture2D::allocLevel(&this->m_textures[1]->m_refTexture,(int)lVar8);
      uVar7 = (int)(lVar8 << 0x15) - (int)lVar8;
      local_19c = uVar7 | 0xff000000;
      pPVar1 = (this->m_textures[1]->m_refTexture).super_TextureLevelPyramid.m_access.
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start;
      tcu::RGBA::toVec((RGBA *)&local_198);
      local_1a0 = ~uVar7 | 0xff000000;
      local_1b8.m_data[0] = 0.0;
      local_1b8.m_data[1] = 0.0;
      local_1b8.m_data[2] = 0.0;
      local_1b8.m_data[3] = 0.0;
      lVar4 = 0;
      do {
        local_1b8.m_data[lVar4] =
             *(float *)((long)&local_198 + lVar4 * 4) *
             *(float *)((long)&local_188._M_dataplus._M_p + lVar4 * 4);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      local_168.m_data[0] = 0.0;
      local_168.m_data[1] = 0.0;
      local_168.m_data[2] = 0.0;
      local_168.m_data[3] = 0.0;
      lVar4 = 0;
      do {
        local_168.m_data[lVar4] =
             local_1b8.m_data[lVar4] + *(float *)((long)&local_158._M_dataplus._M_p + lVar4 * 4);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      tcu::RGBA::toVec(local_110);
      local_128[0] = 0.0;
      local_128[1] = 0.0;
      local_128[2] = 0.0;
      local_128[3] = 0.0;
      lVar4 = 0;
      do {
        local_128[lVar4] =
             (float)local_110[lVar4].m_value *
             *(float *)((long)&local_188._M_dataplus._M_p + lVar4 * 4);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      local_138.m_data._0_8_ = (undefined1 *)0x0;
      local_138.m_data[2] = 0.0;
      local_138.m_data[3] = 0.0;
      lVar4 = 0;
      do {
        local_138.m_data[lVar4] =
             local_128[lVar4] + *(float *)((long)&local_158._M_dataplus._M_p + lVar4 * 4);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      tcu::fillWithGrid(pPVar1 + lVar8,4,&local_168,&local_138);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 8);
    lVar8 = 0;
    do {
      iVar2 = (*this->m_textures[lVar8]->_vptr_Texture2D[2])();
      lVar8 = lVar8 + 1;
    } while (lVar8 == 1);
    return iVar2;
  }
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  this->m_program);
  glwGetIntegerv(0x8b4c,(GLint *)local_100);
  pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  if ((int)local_100._0_4_ < 1) {
    tcu::NotSupportedError::NotSupportedError
              (pNVar5,"Vertex texture image units not supported",
               glcts::fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexTextureTests.cpp"
               ,0x23c);
    ppuVar6 = &tcu::NotSupportedError::typeinfo;
  }
  else {
    tcu::TestError::TestError
              ((TestError *)pNVar5,"Failed to compile shader",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexTextureTests.cpp"
               ,0x23e);
    ppuVar6 = &tcu::TestError::typeinfo;
  }
  __cxa_throw(pNVar5,ppuVar6,tcu::Exception::~Exception);
}

Assistant:

void Vertex2DTextureCase::init (void)
{
	const char* const vertexShader =
		"#version 300 es\n"
		"in highp vec2 a_position;\n"
		"in highp vec2 a_texCoord;\n"
		"uniform highp sampler2D u_texture;\n"
		"uniform highp float u_lod;\n"
		"out mediump vec4 v_color;\n"
		"\n"
		"void main()\n"
		"{\n"
		"	gl_Position = vec4(a_position, 0.0, 1.0);\n"
		"	v_color = textureLod(u_texture, a_texCoord, u_lod);\n"
		"}\n";

	const char* const fragmentShader =
		"#version 300 es\n"
		"layout(location = 0) out mediump vec4 dEQP_FragColor;\n"
		"in mediump vec4 v_color;\n"
		"\n"
		"void main()\n"
		"{\n"
		"	dEQP_FragColor = v_color;\n"
		"}\n";

	if (m_context.getRenderTarget().getNumSamples() != 0)
		throw tcu::NotSupportedError("MSAA config not supported by this test");

	DE_ASSERT(!m_program);
	m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::makeVtxFragSources(vertexShader, fragmentShader));

	if(!m_program->isOk())
	{
		m_testCtx.getLog() << *m_program;

		GLint maxVertexTextures;
		glGetIntegerv(GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS, &maxVertexTextures);

		if (maxVertexTextures < 1)
			throw tcu::NotSupportedError("Vertex texture image units not supported", "", __FILE__, __LINE__);
		else
			TCU_FAIL("Failed to compile shader");
	}

	// Make the textures.
	try
	{
		// Compute suitable power-of-two sizes (for mipmaps).
		const int texWidth		= 1 << deLog2Ceil32(MAX_2D_RENDER_WIDTH / 2);
		const int texHeight		= 1 << deLog2Ceil32(MAX_2D_RENDER_HEIGHT / 2);

		for (int i = 0; i < 2; i++)
		{
			DE_ASSERT(!m_textures[i]);
			m_textures[i] = new glu::Texture2D(m_context.getRenderContext(), GL_RGB, GL_UNSIGNED_BYTE, texWidth, texHeight);
		}

		const bool						mipmaps		= (deIsPowerOfTwo32(texWidth) && deIsPowerOfTwo32(texHeight));
		const int						numLevels	= mipmaps ? deLog2Floor32(de::max(texWidth, texHeight))+1 : 1;
		const tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(m_textures[0]->getRefTexture().getFormat());
		const Vec4						cBias		= fmtInfo.valueMin;
		const Vec4						cScale		= fmtInfo.valueMax-fmtInfo.valueMin;

		// Fill first with gradient texture.
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			const Vec4 gMin = Vec4(-0.5f, -0.5f, -0.5f, 2.0f)*cScale + cBias;
			const Vec4 gMax = Vec4( 1.0f,  1.0f,  1.0f, 0.0f)*cScale + cBias;

			m_textures[0]->getRefTexture().allocLevel(levelNdx);
			tcu::fillWithComponentGradients(m_textures[0]->getRefTexture().getLevel(levelNdx), gMin, gMax);
		}

		// Fill second with grid texture.
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			const deUint32 step		= 0x00ffffff / numLevels;
			const deUint32 rgb		= step*levelNdx;
			const deUint32 colorA	= 0xff000000 | rgb;
			const deUint32 colorB	= 0xff000000 | ~rgb;

			m_textures[1]->getRefTexture().allocLevel(levelNdx);
			tcu::fillWithGrid(m_textures[1]->getRefTexture().getLevel(levelNdx), 4, tcu::RGBA(colorA).toVec()*cScale + cBias, tcu::RGBA(colorB).toVec()*cScale + cBias);
		}

		// Upload.
		for (int i = 0; i < 2; i++)
			m_textures[i]->upload();
	}
	catch (const std::exception&)
	{
		// Clean up to save memory.
		Vertex2DTextureCase::deinit();
		throw;
	}
}